

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RaiseSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *thing;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *this;
  char *pcVar6;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_48;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e84b1;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e84a1:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e84b1:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x121e,
                  "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e83f5;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e84b1;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e84a1;
LAB_003e83f5:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003e841d:
      iVar1 = param[1].field_0.i;
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&FStack_48,0x80);
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->master);
      if (pAVar3 != (AActor *)0x0) {
        pAVar3 = this;
        if (iVar1 == 0) {
          pAVar3 = (AActor *)0x0;
        }
        while( true ) {
          thing = (AActor *)FThinkerIterator::Next(&FStack_48,false);
          if (thing == (AActor *)0x0) break;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->master);
          pAVar5 = GC::ReadBarrier<AActor>((AActor **)&thing->master);
          if ((thing != this) && (pAVar5 == pAVar4)) {
            P_Thing_Raise(thing,pAVar3);
          }
        }
      }
      return 0;
    }
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003e841d;
    pcVar6 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x121f,
                "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self)
			{
				P_Thing_Raise(mo, copy ? self : NULL);
			}
		}
	}
	return 0;
}